

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

uint duckdb_zstd::HUF_minTableLog(uint symbolCardinality)

{
  uint uVar1;
  
  uVar1 = 0x1f;
  if (symbolCardinality != 0) {
    for (; symbolCardinality >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return (uVar1 ^ 0xffffffe0) + 0x21;
}

Assistant:

MEM_STATIC unsigned ZSTD_countLeadingZeros32(U32 val)
{
    assert(val != 0);
#   if defined(_MSC_VER)
#       if STATIC_BMI2 == 1
            return (unsigned)_lzcnt_u32(val);
#       else
            if (val != 0) {
                unsigned long r;
                _BitScanReverse(&r, val);
                return (unsigned)(31 - r);
            } else {
                /* Should not reach this code path */
                __assume(0);
            }
#       endif
#   elif defined(__GNUC__) && (__GNUC__ >= 4)
        return (unsigned)__builtin_clz(val);
#   else
        return ZSTD_countLeadingZeros32_fallback(val);
#   endif
}